

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

JavascriptString * __thiscall Js::ScriptContext::GetIntegerString(ScriptContext *this,Var aValue)

{
  int32 value;
  JavascriptString *pJVar1;
  
  value = TaggedInt::ToInt32(aValue);
  pJVar1 = GetIntegerString(this,value);
  return pJVar1;
}

Assistant:

JavascriptString* ScriptContext::GetIntegerString(Var aValue)
    {
        return this->GetIntegerString(TaggedInt::ToInt32(aValue));
    }